

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utf8_checker.c
# Opt level: O2

void test_utf8(void)

{
  uint8_t *string;
  uint8_t uVar1;
  size_t count;
  long lVar2;
  cio_utf8_state state;
  
  lVar2 = 8;
  while( true ) {
    if (lVar2 == 0xb8) {
      return;
    }
    cio_utf8_init(&state);
    string = *(uint8_t **)((long)&__do_global_dtors_aux_fini_array_entry + lVar2);
    count = strlen((char *)string);
    uVar1 = cio_check_utf8(&state,string,count);
    if (uVar1 != *(uint8_t *)((long)&PTR_anon_var_dwarf_a9_00105d20 + lVar2)) break;
    lVar2 = lVar2 + 0x10;
  }
  UnityFail("Test pattern not checked successfully!",0x4d);
}

Assistant:

static void test_utf8(void)
{
	struct test_entry entries[] = {
	    {.test_pattern = (const uint8_t *)"\xe7\xae\x80\xe4\xbd\x93\xe4\xb8\xad\xe6\x96\x87\x00", .valid = CIO_UTF8_ACCEPT},
	    {.test_pattern = (const uint8_t *)"Hello\xf8\x88\x80\x80\x80", .valid = CIO_UTF8_REJECT},
	    {.test_pattern = (const uint8_t *)"Hello12\xf8\x88\x80\x80\x80", .valid = CIO_UTF8_REJECT},
	    {.test_pattern = (const uint8_t *)"Hello123\xf8\x88\x80\x80\x80", .valid = CIO_UTF8_REJECT},
	    {.test_pattern = (const uint8_t *)"Hello1234\xf8\x88\x80\x80\x80", .valid = CIO_UTF8_REJECT},
	    {.test_pattern = (const uint8_t *)"Hello12345\xf8\x88\x80\x80\x80", .valid = CIO_UTF8_REJECT},
	    {.test_pattern = (const uint8_t *)"Hello123456\xf8\x88\x80\x80\x80", .valid = CIO_UTF8_REJECT},
	    {.test_pattern = (const uint8_t *)"Hello1234567\xf8\x88\x80\x80\x80", .valid = CIO_UTF8_REJECT},
	    {.test_pattern = (const uint8_t *)"Hello12345678\xf8\x88\x80\x80\x80", .valid = CIO_UTF8_REJECT},
	    {.test_pattern = (const uint8_t *)"H", .valid = CIO_UTF8_ACCEPT},
	    {.test_pattern = (const uint8_t *)"\xf8\x88\x80\x80\x80", .valid = CIO_UTF8_REJECT}};

	for (unsigned int i = 0; i < ARRAY_SIZE(entries); i++) {
		struct cio_utf8_state state;
		cio_utf8_init(&state);
		struct test_entry entry = entries[i];
		uint8_t result = cio_check_utf8(&state, entry.test_pattern, strlen((const char *)entry.test_pattern));
		TEST_ASSERT_MESSAGE(result == entry.valid, "Test pattern not checked successfully!");
	}
}